

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

int __thiscall Catch::Session::runInternal(Session *this)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _func_int **pp_Var2;
  TestCase *pTVar3;
  tuple<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tVar4;
  undefined8 *puVar5;
  undefined8 uVar6;
  IStreamingReporter *pIVar7;
  ulong uVar8;
  byte bVar9;
  bool bVar10;
  int iVar11;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar12;
  undefined4 extraout_var;
  long *plVar13;
  long lVar14;
  element_type *peVar15;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar16;
  undefined4 extraout_var_05;
  char *pcVar17;
  ostream *poVar18;
  SpecialProperties SVar19;
  pointer *__ptr;
  pointer pbVar20;
  undefined8 *puVar21;
  TestCase *testCase;
  shared_ptr<Catch::Config> *psVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *input;
  _Head_base<0UL,_Catch::IStreamingReporter_*,_false> __x;
  size_t sVar23;
  undefined1 auVar24 [12];
  IStreamingReporterPtr reporter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  Totals totals;
  TestSpec testSpec;
  ReusableStringStream testConfig;
  string filename;
  _Head_base<0UL,_Catch::IStreamingReporter_*,_false> local_318;
  shared_ptr<Catch::Config> *local_310;
  undefined1 local_308 [16];
  undefined1 local_2f8 [40];
  undefined1 local_2d0 [16];
  pointer pbStack_2c0;
  size_t local_2b8;
  undefined8 *puStack_2b0;
  size_t local_2a8;
  size_t sStack_2a0;
  pointer local_298;
  size_t sStack_290;
  undefined8 *local_288;
  size_t sStack_280;
  IStreamingReporter *local_270;
  TestSpec local_268;
  ReusableStringStream local_250;
  undefined1 local_240 [240];
  element_type *local_150;
  ulong local_130;
  _Head_base<0UL,_Catch::IStreamingReporter_*,_false> local_108;
  
  pbStack_2c0._0_4_ = 1;
  if (((this->m_startupExceptions == false) &&
      (pbStack_2c0._0_4_ = 0, (this->m_configData).showHelp == false)) &&
     ((this->m_configData).libIdentify == false)) {
    config(this);
    seedRng(&((this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->super_IConfig);
    local_310 = &this->m_config;
    if ((this->m_configData).filenamesAsTags == true) {
      peVar15 = (local_310->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pSVar12 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
                ::getInternal();
      iVar11 = (*(pSVar12->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar12);
      plVar13 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar11) + 0x18))
                                  ((long *)CONCAT44(extraout_var,iVar11),peVar15);
      lVar1 = plVar13[1];
      if (*plVar13 != lVar1) {
        __x._M_head_impl = (IStreamingReporter *)(*plVar13 + 0x60);
        do {
          clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_308,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)__x._M_head_impl);
          std::__cxx11::string::string
                    ((string *)local_240,
                     (char *)(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)(__x._M_head_impl + 6))->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start,(allocator *)&local_268);
          lVar14 = std::__cxx11::string::find_last_of((char *)local_240,0x16d789,0xffffffffffffffff)
          ;
          if (lVar14 != -1) {
            std::__cxx11::string::erase((ulong)local_240,0);
            *(char *)local_240._0_8_ = '#';
          }
          peVar15 = (element_type *)
                    std::__cxx11::string::rfind
                              ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_240,0x2e);
          if (peVar15 != (element_type *)0xffffffffffffffff) {
            if ((ulong)local_240._8_8_ < peVar15) {
              auVar24 = std::__throw_out_of_range_fmt
                                  ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                                   "basic_string::erase",peVar15);
              if ((IStreamingReporter *)local_308._0_8_ != __x._M_head_impl) {
                operator_delete((void *)local_308._0_8_);
              }
              ReusableStringStream::~ReusableStringStream(&local_250);
              clara::std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
              ::~vector(&local_268.m_filters);
              RunContext::~RunContext((RunContext *)local_240);
              if (local_318._M_head_impl != (IStreamingReporter *)0x0) {
                (*(local_318._M_head_impl)->_vptr_IStreamingReporter[1])();
              }
              if (auVar24._8_4_ == 1) {
                plVar13 = (long *)__cxa_begin_catch(auVar24._0_8_);
                pcVar17 = (char *)(**(code **)(*plVar13 + 0x10))(plVar13);
                poVar18 = std::operator<<((ostream *)&std::cerr,pcVar17);
                std::endl<char,std::char_traits<char>>(poVar18);
                __cxa_end_catch();
                return 0xff;
              }
              _Unwind_Resume(auVar24._0_8_);
            }
            *(char *)(local_240._0_8_ + (long)peVar15) = '\0';
            local_240._8_8_ = peVar15;
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_308,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240)
          ;
          clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2d0,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_308);
          setTags((TestCaseInfo *)(__x._M_head_impl + -0xc),
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_2d0);
          clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_2d0);
          if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
            operator_delete((void *)local_240._0_8_);
          }
          clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_308);
          lVar14 = (long)(__x._M_head_impl + 0xb);
          __x._M_head_impl = __x._M_head_impl + 0x17;
        } while (lVar14 != lVar1);
      }
    }
    list((Catch *)local_240,local_310);
    if ((int *)local_240._0_8_ == (int *)0x0) {
      pSVar12 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
                ::getInternal();
      iVar11 = (*(pSVar12->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar12);
      plVar13 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar11) + 0x20))
                                  ((long *)CONCAT44(extraout_var_00,iVar11));
      if (*plVar13 == plVar13[1]) {
        local_240._0_8_ =
             (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_240._8_8_ =
             (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_)->_M_use_count + 1
            ;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_)->_M_use_count + 1
            ;
          }
        }
        anon_unknown_1::createReporter
                  ((anon_unknown_1 *)&local_318,
                   &(((element_type *)local_240._0_8_)->m_data).reporterName,(IConfigPtr *)local_240
                  );
      }
      else {
        local_318._M_head_impl = (IStreamingReporter *)operator_new(0x30);
        (local_318._M_head_impl)->_vptr_IStreamingReporter =
             (_func_int **)&PTR__ListeningReporter_00195dc8;
        *(undefined1 (*) [16])(local_318._M_head_impl + 1) = (undefined1  [16])0x0;
        *(undefined1 (*) [16])(local_318._M_head_impl + 3) = (undefined1  [16])0x0;
        *(undefined2 *)&local_318._M_head_impl[5]._vptr_IStreamingReporter = 0x100;
        local_270 = local_318._M_head_impl;
        pSVar12 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
                  ::getInternal();
        iVar11 = (*(pSVar12->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar12);
        plVar13 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar11) + 0x20))
                                    ((long *)CONCAT44(extraout_var_01,iVar11));
        puVar21 = (undefined8 *)*plVar13;
        local_288 = (undefined8 *)plVar13[1];
        if (puVar21 != local_288) {
          local_298 = (pointer)(local_270 + 1);
          do {
            plVar13 = (long *)*puVar21;
            peVar15 = (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            this_00 = (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                this_00->_M_use_count = this_00->_M_use_count + 1;
                UNLOCK();
              }
              else {
                this_00->_M_use_count = this_00->_M_use_count + 1;
              }
            }
            iVar11 = (*(peVar15->super_IConfig).super_NonCopyable._vptr_NonCopyable[3])(peVar15);
            local_240._0_8_ = CONCAT44(extraout_var_02,iVar11);
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                this_00->_M_use_count = this_00->_M_use_count + 1;
                UNLOCK();
              }
              else {
                this_00->_M_use_count = this_00->_M_use_count + 1;
              }
            }
            local_240._8_8_ = peVar15;
            local_240._16_8_ = this_00;
            (**(code **)(*plVar13 + 0x10))
                      ((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                        *)local_308,plVar13,local_240);
            std::
            vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
            ::
            emplace_back<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>
                      ((vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
                        *)local_298,
                       (unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                        *)local_308);
            if ((_Head_base<0UL,_Catch::IStreamingReporter_*,_false>)local_308._0_8_ !=
                (_Head_base<0UL,_Catch::IStreamingReporter_*,_false>)0x0) {
              (*(code *)((((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_308._0_8_)->_M_impl).super__Vector_impl_data._M_start)->
                        _M_string_length)();
            }
            local_308._0_8_ =
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._16_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._16_8_);
            }
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            }
            puVar21 = puVar21 + 2;
          } while (puVar21 != local_288);
        }
        pIVar7 = local_270;
        local_240._0_8_ =
             (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_240._8_8_ =
             (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_)->_M_use_count + 1
            ;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_)->_M_use_count + 1
            ;
          }
        }
        anon_unknown_1::createReporter
                  ((anon_unknown_1 *)local_308,
                   &(((element_type *)local_240._0_8_)->m_data).reporterName,(IConfigPtr *)local_240
                  );
        uVar6 = local_308._0_8_;
        local_308._0_8_ = (IStreamingReporter *)0x0;
        pp_Var2 = pIVar7[4]._vptr_IStreamingReporter;
        pIVar7[4]._vptr_IStreamingReporter = (_func_int **)uVar6;
        if (pp_Var2 != (_func_int **)0x0) {
          (**(code **)(*pp_Var2 + 8))();
        }
        bVar9 = (**(code **)(*pIVar7[4]._vptr_IStreamingReporter + 0x10))();
        *(byte *)&pIVar7[5]._vptr_IStreamingReporter = bVar9 & 1;
        if ((_Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
             )local_308._0_8_ != (IStreamingReporter *)0x0) {
          (**(code **)(*(long *)local_308._0_8_ + 8))();
        }
        local_308._0_8_ =
             (__uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
              )0x0;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_);
      }
      psVar22 = local_310;
      local_308._0_8_ =
           (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_308._8_8_ =
           (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_)->_M_use_count + 1;
        }
      }
      RunContext::RunContext
                ((RunContext *)local_240,(IConfigPtr *)local_308,(IStreamingReporterPtr *)&local_318
                );
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_308._8_8_);
      }
      local_2d0._0_4_ = 0;
      stack0xfffffffffffffd38 = (undefined1  [16])0x0;
      local_2b8 = 0;
      puStack_2b0 = (undefined8 *)0x0;
      local_2a8 = 0;
      sStack_2a0 = 0;
      (*(((psVar22->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        super_IConfig).super_NonCopyable._vptr_NonCopyable[4])(local_308);
      RunContext::testGroupStarting((RunContext *)local_240,(string *)local_308,1,1);
      if ((element_type *)local_308._0_8_ != (element_type *)(local_308 + 0x10)) {
        operator_delete((void *)local_308._0_8_);
      }
      iVar11 = (*(((psVar22->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                 ->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xc])();
      clara::std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
                (&local_268.m_filters,
                 (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
                 CONCAT44(extraout_var_03,iVar11));
      peVar15 = (psVar22->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pSVar12 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
                ::getInternal();
      iVar11 = (*(pSVar12->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar12);
      plVar13 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar11) + 0x18))
                                  ((long *)CONCAT44(extraout_var_04,iVar11),peVar15);
      testCase = (TestCase *)*plVar13;
      pTVar3 = (TestCase *)plVar13[1];
      pbVar20 = (pointer)local_2d0._8_8_;
      if (testCase != pTVar3) {
        local_298 = pbStack_2c0;
        sStack_290 = local_2b8;
        local_288 = puStack_2b0;
        sStack_280 = local_2a8;
        sVar23 = sStack_2a0;
        do {
          if (local_268.m_filters.
              super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              local_268.m_filters.
              super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            SVar19 = IsHidden;
LAB_00124dc5:
            bVar10 = ((testCase->super_TestCaseInfo).properties & SVar19) == None;
          }
          else {
            peVar15 = (local_310->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr;
            bVar10 = TestSpec::matches(&local_268,&testCase->super_TestCaseInfo);
            if (bVar10) {
              iVar11 = (*(peVar15->super_IConfig).super_NonCopyable._vptr_NonCopyable[2])(peVar15);
              SVar19 = Throws;
              bVar10 = true;
              if ((char)iVar11 == '\0') goto LAB_00124dc5;
            }
            else {
              bVar10 = false;
            }
          }
          uVar8 = local_130;
          iVar11 = (*(local_150->super_NonCopyable)._vptr_NonCopyable[9])();
          if (bVar10 && uVar8 < (ulong)(long)iVar11) {
            RunContext::runTest((Totals *)local_308,(RunContext *)local_240,testCase);
            pbVar20 = (pointer)((long)&(pbVar20->_M_dataplus)._M_p + local_308._8_8_);
            local_298 = (pointer)((long)&(local_298->_M_dataplus)._M_p + local_2f8._0_8_);
            sStack_290 = sStack_290 + local_2f8._8_8_;
            local_288 = (undefined8 *)((long)local_288 + local_2f8._16_8_);
            sStack_280 = sStack_280 + local_2f8._24_8_;
            sVar23 = sVar23 + local_2f8._32_8_;
          }
          else {
            (*(local_108._M_head_impl)->_vptr_IStreamingReporter[0x10])
                      (local_108._M_head_impl,testCase);
          }
          testCase = testCase + 1;
        } while (testCase != pTVar3);
        pbStack_2c0 = local_298;
        local_2b8 = sStack_290;
        puStack_2b0 = local_288;
        local_2a8 = sStack_280;
        sStack_2a0 = sVar23;
      }
      psVar22 = local_310;
      local_2d0._8_8_ = pbVar20;
      iVar11 = (*(((local_310->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  )->super_IConfig).super_NonCopyable._vptr_NonCopyable[8])();
      if (((char)iVar11 != '\0') && ((long)puStack_2b0 + sStack_2a0 + local_2a8 == 0)) {
        pSVar16 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
                  getInternal();
        sVar23 = StringStreams::add(&pSVar16->super_StringStreams);
        local_250.m_index = sVar23;
        pSVar16 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
                  getInternal();
        tVar4.
        super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             *(_Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&(pSVar16->super_StringStreams).m_streams.
                  super__Vector_base<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[sVar23]._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ;
        local_250.m_oss =
             (ostream *)
             tVar4.
             super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
        iVar11 = (*(((psVar22->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                    )->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xe])();
        puVar21 = *(undefined8 **)CONCAT44(extraout_var_05,iVar11);
        puVar5 = (undefined8 *)((long *)CONCAT44(extraout_var_05,iVar11))[1];
        if (puVar21 != puVar5) {
          bVar10 = true;
          do {
            if (!bVar10) {
              local_308[0] = 0x20;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         tVar4.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl,local_308,1);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)
                       tVar4.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl,(char *)*puVar21,puVar21[1]);
            puVar21 = puVar21 + 4;
            bVar10 = false;
          } while (puVar21 != puVar5);
        }
        std::__cxx11::stringbuf::str();
        (*(local_108._M_head_impl)->_vptr_IStreamingReporter[3])(local_108._M_head_impl,local_308);
        psVar22 = local_310;
        if ((element_type *)local_308._0_8_ != (element_type *)(local_308 + 0x10)) {
          operator_delete((void *)local_308._0_8_);
        }
        local_2d0._0_4_ = -1;
        ReusableStringStream::~ReusableStringStream(&local_250);
      }
      (*(((psVar22->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        super_IConfig).super_NonCopyable._vptr_NonCopyable[4])(local_308);
      RunContext::testGroupEnded
                ((RunContext *)local_240,(string *)local_308,(Totals *)local_2d0,1,1);
      if ((element_type *)local_308._0_8_ != (element_type *)(local_308 + 0x10)) {
        operator_delete((void *)local_308._0_8_);
      }
      clara::std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
                (&local_268.m_filters);
      RunContext::~RunContext((RunContext *)local_240);
      if (local_318._M_head_impl != (IStreamingReporter *)0x0) {
        (*(local_318._M_head_impl)->_vptr_IStreamingReporter[1])();
      }
      if ((int)pbStack_2c0 < (int)local_2d0._0_4_) {
        pbStack_2c0._0_4_ = local_2d0._0_4_;
      }
      if (0xfe < (int)pbStack_2c0) {
        pbStack_2c0._0_4_ = 0xff;
      }
    }
    else {
      pbStack_2c0._0_4_ = *(int *)local_240._0_8_;
    }
  }
  return (int)pbStack_2c0;
}

Assistant:

int Session::runInternal() {
        if( m_startupExceptions )
            return 1;

        if (m_configData.showHelp || m_configData.libIdentify) {
            return 0;
        }

        CATCH_TRY {
            config(); // Force config to be constructed

            seedRng( *m_config );

            if( m_configData.filenamesAsTags )
                applyFilenamesAsTags( *m_config );

            // Handle list request
            if( Option<std::size_t> listed = list( m_config ) )
                return static_cast<int>( *listed );

            auto totals = runTests( m_config );
            // Note that on unices only the lower 8 bits are usually used, clamping
            // the return value to 255 prevents false negative when some multiple
            // of 256 tests has failed
            return (std::min) (MaxExitCode, (std::max) (totals.error, static_cast<int>(totals.assertions.failed)));
        }